

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_heuristics.cpp
# Opt level: O1

idx_t duckdb::ExpressionHeuristics::ExpressionCost(BoundCastExpression *expr)

{
  LogicalType *this;
  LogicalTypeId LVar1;
  bool bVar2;
  pointer pEVar3;
  type expr_00;
  idx_t iVar4;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  long lVar5;
  LogicalType local_58;
  LogicalType local_40;
  
  this = &(expr->super_Expression).return_type;
  this_00 = &expr->child;
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  LogicalType::LogicalType(&local_58,&pEVar3->return_type);
  bVar2 = LogicalType::operator==(this,&local_58);
  LogicalType::~LogicalType(&local_58);
  if (bVar2) {
    lVar5 = 0;
  }
  else {
    LVar1 = this->id_;
    lVar5 = 200;
    if (LVar1 == VARCHAR) {
      bVar2 = false;
    }
    else {
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_00);
      LogicalType::LogicalType(&local_58,&pEVar3->return_type);
      bVar2 = false;
      if ((local_58.id_ != VARCHAR) && (this->id_ != BLOB)) {
        pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_00);
        LogicalType::LogicalType(&local_40,&pEVar3->return_type);
        lVar5 = 5;
        if (local_40.id_ == BLOB) {
          lVar5 = 200;
        }
        bVar2 = true;
      }
    }
    if (bVar2) {
      LogicalType::~LogicalType(&local_40);
    }
    if (LVar1 != VARCHAR) {
      LogicalType::~LogicalType(&local_58);
    }
  }
  expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (this_00);
  iVar4 = Cost(expr_00);
  return iVar4 + lVar5;
}

Assistant:

idx_t ExpressionHeuristics::ExpressionCost(BoundCastExpression &expr) {
	// OPERATOR_CAST
	// determine cast cost by comparing cast_expr.source_type and cast_expr_target_type
	idx_t cast_cost = 0;
	if (expr.return_type != expr.source_type()) {
		// if cast from or to varchar
		// TODO: we might want to add more cases
		if (expr.return_type.id() == LogicalTypeId::VARCHAR || expr.source_type().id() == LogicalTypeId::VARCHAR ||
		    expr.return_type.id() == LogicalTypeId::BLOB || expr.source_type().id() == LogicalTypeId::BLOB) {
			cast_cost = 200;
		} else {
			cast_cost = 5;
		}
	}
	return Cost(*expr.child) + cast_cost;
}